

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborparser.c
# Opt level: O0

CborError preparse_next_value(CborValue *it)

{
  uint32_t uVar1;
  CborValue *in_RDI;
  bool bVar2;
  bool itemCounts;
  CborError local_4;
  
  bVar2 = in_RDI->type != 0xc0;
  if (((in_RDI->remaining == 0xffffffff) || (!bVar2)) ||
     (uVar1 = in_RDI->remaining - 1, in_RDI->remaining = uVar1, uVar1 != 0)) {
    if (bVar2) {
      in_RDI->flags = in_RDI->flags ^ 0x40;
    }
    local_4 = preparse_next_value_nodecrement(in_RDI);
  }
  else {
    in_RDI->type = 0xff;
    in_RDI->flags = in_RDI->flags & 0xef;
    local_4 = CborNoError;
  }
  return local_4;
}

Assistant:

static CborError preparse_next_value(CborValue *it)
{
    /* tags don't count towards item totals or whether we've successfully
     * read a map's key or value */
    bool itemCounts = it->type != CborTagType;

    if (it->remaining != UINT32_MAX) {
        if (itemCounts && --it->remaining == 0) {
            it->type = CborInvalidType;
            it->flags &= ~CborIteratorFlag_UnknownLength; /* no Break to consume */
            return CborNoError;
        }
    }
    if (itemCounts) {
        /* toggle the flag indicating whether this was a map key */
        it->flags ^= CborIteratorFlag_NextIsMapKey;
    }
    return preparse_next_value_nodecrement(it);
}